

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_datetime<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  local_date d;
  local_datetime_format_info fmt_00;
  local_time t;
  bool bVar1;
  char_type_conflict cVar2;
  error_type *v;
  location *first_00;
  __tuple_element_t<1UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var3;
  location *last;
  __tuple_element_t<0UL,_tuple<local_date,_local_date_format_info,_region>_> *p_Var4;
  value_type *this;
  __tuple_element_t<0UL,_tuple<local_time,_local_time_format_info,_region>_> *p_Var5;
  source_location in_RDI;
  local_datetime val;
  region reg;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  source_location src;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  local_datetime_format_info fmt;
  location first;
  context<toml::type_config> *in_stack_00001590;
  location *in_stack_00001598;
  source_location *in_stack_fffffffffffff7d8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff7e0;
  size_t in_stack_fffffffffffff7e8;
  location *in_stack_fffffffffffff7f0;
  location *in_stack_fffffffffffff7f8;
  location *in_stack_fffffffffffff800;
  region *in_stack_fffffffffffff810;
  char *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffff838;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *loc_00;
  undefined6 in_stack_fffffffffffff850;
  undefined2 in_stack_fffffffffffff856;
  undefined6 in_stack_fffffffffffff858;
  undefined2 in_stack_fffffffffffff85e;
  source_location *in_stack_fffffffffffff860;
  undefined1 in_stack_fffffffffffff868 [14];
  undefined8 in_stack_fffffffffffff880;
  undefined8 v_00;
  string *in_stack_fffffffffffff998;
  source_location *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  local_datetime local_52e [8];
  undefined **local_4b8;
  undefined **local_4b0;
  undefined **local_4a8;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b1 [5];
  allocator<char> local_311 [437];
  undefined4 local_15c;
  undefined **local_158;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  local_e8;
  local_datetime_format_info local_70 [7];
  
  loc_00 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)in_RDI._M_impl;
  location::location(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_datetime_format_info::local_datetime_format_info(local_70);
  parse_local_date_only<toml::type_config>
            ((location *)src.length_,(context<toml::type_config> *)src.last_offset_);
  bVar1 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_e8);
  if (bVar1) {
    local_158 = &PTR_s__workspace_llm4binary_github_lic_00933238;
    v = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
        ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                      *)in_stack_fffffffffffff838,in_RDI);
    err<toml::error_info&>(v);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff7e0,(failure_type *)in_stack_fffffffffffff7d8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x669033);
    local_15c = 1;
  }
  else {
    cVar2 = location::current((location *)in_stack_fffffffffffff7d8);
    if (cVar2 == 'T') {
      location::advance(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      local_70[0].delimiter = upper_T;
    }
    else {
      cVar2 = location::current((location *)in_stack_fffffffffffff7d8);
      if (cVar2 == 't') {
        location::advance(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_70[0].delimiter = lower_t;
      }
      else {
        cVar2 = location::current((location *)in_stack_fffffffffffff7d8);
        if (cVar2 != ' ') {
          region::region((region *)CONCAT26(in_stack_fffffffffffff856,in_stack_fffffffffffff850),
                         (location *)loc_00);
          source_location::source_location
                    (in_stack_fffffffffffff860,
                     (region *)CONCAT26(in_stack_fffffffffffff85e,in_stack_fffffffffffff858));
          region::~region((region *)in_stack_fffffffffffff7e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                     (allocator<char> *)in_stack_fffffffffffff810);
          source_location::source_location
                    ((source_location *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
          this_01 = local_3b1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_01,in_stack_fffffffffffff818,(allocator<char> *)in_stack_fffffffffffff810)
          ;
          make_error_info<>(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                            in_stack_fffffffffffff998);
          err<toml::error_info>((error_info *)in_stack_fffffffffffff838);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_fffffffffffff7e0,(failure_type *)in_stack_fffffffffffff7d8);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66925e);
          error_info::~error_info((error_info *)in_stack_fffffffffffff7e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
          std::allocator<char>::~allocator((allocator<char> *)local_3b1);
          source_location::~source_location((source_location *)in_stack_fffffffffffff7e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
          std::allocator<char>::~allocator(local_311);
          local_15c = 1;
          source_location::~source_location((source_location *)in_stack_fffffffffffff7e0);
          goto LAB_00669819;
        }
        location::advance(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        local_70[0].delimiter = space;
      }
    }
    parse_local_time_only<toml::type_config>(in_stack_00001598,in_stack_00001590);
    bVar1 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
            ::is_err(&local_448);
    if (bVar1) {
      local_4a8 = &PTR_s__workspace_llm4binary_github_lic_00933250;
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::unwrap_err(in_stack_fffffffffffff838,in_RDI);
      err<toml::error_info&>((error_info *)in_stack_fffffffffffff838);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff7e0,(failure_type *)in_stack_fffffffffffff7d8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66944e);
      local_15c = 1;
    }
    else {
      local_4b0 = &PTR_s__workspace_llm4binary_github_lic_00933268;
      first_00 = (location *)
                 result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                 ::unwrap(in_stack_fffffffffffff838,in_RDI);
      p_Var3 = std::get<1ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                         ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                           *)0x6694d2);
      local_70[0].has_seconds = (bool)(p_Var3->has_seconds & 1);
      local_4b8 = &PTR_s__workspace_llm4binary_github_lic_00933280;
      last = (location *)
             result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(in_stack_fffffffffffff838,in_RDI);
      p_Var3 = std::get<1ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                         ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                           *)0x669512);
      local_70[0].subsecond_precision = p_Var3->subsecond_precision;
      region::region(in_stack_fffffffffffff810,first_00,last);
      result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
      ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                *)in_stack_fffffffffffff838,in_RDI);
      p_Var4 = std::get<0ul,toml::local_date,toml::local_date_format_info,toml::detail::region>
                         ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                           *)0x669572);
      d.year = p_Var4->year;
      d.month = p_Var4->month;
      d.day = p_Var4->day;
      this = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(in_stack_fffffffffffff838,in_RDI);
      p_Var5 = std::get<0ul,toml::local_time,toml::local_time_format_info,toml::detail::region>
                         ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                           *)0x6695b0);
      t.hour = p_Var5->hour;
      t.minute = p_Var5->minute;
      t.second = p_Var5->second;
      t._3_1_ = p_Var5->field_0x3;
      t.millisecond = p_Var5->millisecond;
      t.microsecond = p_Var5->microsecond;
      t.nanosecond = p_Var5->nanosecond;
      local_datetime::local_datetime(local_52e,d,t);
      v_00 = (basic_value<toml::type_config> *)0x0;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x669666);
      this_00 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                &stack0xfffffffffffff860;
      region::region((region *)this_00,(region *)in_stack_fffffffffffff7d8);
      fmt_00.subsecond_precision._0_4_ = local_52e[0].date;
      fmt_00.subsecond_precision._4_1_ = local_52e[0].time.hour;
      fmt_00.subsecond_precision._5_1_ = local_52e[0].time.minute;
      fmt_00._0_8_ = loc_00;
      fmt_00.subsecond_precision._6_1_ = local_52e[0].time.second;
      fmt_00.subsecond_precision._7_1_ = local_52e[0].time._3_1_;
      in_stack_fffffffffffff7e0 = this_00;
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)in_RDI._M_impl,
                 (local_datetime_type)in_stack_fffffffffffff868,fmt_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff838,(region_type *)in_stack_fffffffffffff880);
      ok<toml::basic_value<toml::type_config>>((basic_value<toml::type_config> *)v_00);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff7e0,(success_type *)this_00);
      success<toml::basic_value<toml::type_config>_>::~success
                ((success<toml::basic_value<toml::type_config>_> *)0x66971e);
      basic_value<toml::type_config>::~basic_value
                ((basic_value<toml::type_config> *)in_stack_fffffffffffff7e0);
      region::~region((region *)in_stack_fffffffffffff7e0);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
      local_15c = 1;
      region::~region((region *)in_stack_fffffffffffff7e0);
    }
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::~result((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
               *)0x669808);
  }
LAB_00669819:
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             *)0x669826);
  location::~location((location *)in_stack_fffffffffffff7e0);
  return loc_00;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;

    local_datetime_format_info fmt;

    // ----------------------------------------------------------------------

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_local_datetime: "
            "expect date-time delimiter `T`, `t` or ` `(space).",
            std::move(src), "here"));
    }

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------

    region reg(first, loc);
    local_datetime val(std::get<0>(date_fmt_reg.unwrap()),
                       std::get<0>(time_fmt_reg.unwrap()));

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}